

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::java::MessageGenerator::GenerateBuilder
          (MessageGenerator *this,Printer *printer)

{
  int iVar1;
  FieldGenerator *pFVar2;
  Descriptor *pDVar3;
  Descriptor *in_RDX;
  Descriptor *descriptor;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar4;
  uint uVar5;
  long lVar6;
  java *pjVar7;
  int iVar8;
  long lVar9;
  string local_50;
  
  ClassName_abi_cxx11_(&local_50,(java *)this->descriptor_,in_RDX);
  io::Printer::Print(printer,
                     "public static Builder newBuilder() { return Builder.create(); }\npublic Builder newBuilderForType() { return newBuilder(); }\npublic static Builder newBuilder($classname$ prototype) {\n  return newBuilder().mergeFrom(prototype);\n}\npublic Builder toBuilder() { return newBuilder(this); }\n\n"
                     ,"classname",&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  pDVar3 = this->descriptor_;
  if (*(int *)(*(long *)(*(long *)(pDVar3 + 0x10) + 0x88) + 0x50) != 3) {
    io::Printer::Print(printer,
                       "@java.lang.Override\nprotected Builder newBuilderForType(\n    com.google.protobuf.GeneratedMessage.BuilderParent parent) {\n  Builder builder = new Builder(parent);\n  return builder;\n}\n"
                      );
    pDVar3 = this->descriptor_;
  }
  WriteMessageDocComment(printer,pDVar3);
  pjVar7 = (java *)this->descriptor_;
  iVar8 = *(int *)(*(long *)(*(long *)(pjVar7 + 0x10) + 0x88) + 0x50);
  if (*(int *)(pjVar7 + 0x58) < 1) {
    if (iVar8 == 3) {
      ClassName_abi_cxx11_(&local_50,pjVar7,descriptor);
      io::Printer::Print(printer,
                         "public static final class Builder extends\n    com.google.protobuf.GeneratedMessageLite.Builder<\n      $classname$, Builder>\n    implements $classname$OrBuilder {\n"
                         ,"classname",&local_50);
    }
    else {
      ClassName_abi_cxx11_(&local_50,pjVar7,descriptor);
      io::Printer::Print(printer,
                         "public static final class Builder extends\n    com.google.protobuf.GeneratedMessage.Builder<Builder>\n   implements $classname$OrBuilder {\n"
                         ,"classname",&local_50);
    }
  }
  else if (iVar8 == 3) {
    ClassName_abi_cxx11_(&local_50,pjVar7,descriptor);
    io::Printer::Print(printer,
                       "public static final class Builder extends\n    com.google.protobuf.GeneratedMessageLite.ExtendableBuilder<\n      $classname$, Builder> implements $classname$OrBuilder {\n"
                       ,"classname",&local_50);
  }
  else {
    ClassName_abi_cxx11_(&local_50,pjVar7,descriptor);
    io::Printer::Print(printer,
                       "public static final class Builder extends\n    com.google.protobuf.GeneratedMessage.ExtendableBuilder<\n      $classname$, Builder> implements $classname$OrBuilder {\n"
                       ,"classname",&local_50);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  io::Printer::Indent(printer);
  GenerateDescriptorMethods(this,printer);
  GenerateCommonBuilderMethods(this,printer);
  pDVar3 = this->descriptor_;
  if (*(int *)(*(long *)(*(long *)(pDVar3 + 0x10) + 0x88) + 0x50) != 2) {
    GenerateIsInitialized(this,printer,DONT_MEMOIZE);
    GenerateBuilderParsingMethods(this,printer);
    pDVar3 = this->descriptor_;
  }
  if (0 < *(int *)(pDVar3 + 0x2c)) {
    lVar9 = 0;
    lVar6 = 0;
    iVar8 = 0;
    do {
      pFVar2 = FieldGeneratorMap::get
                         (&this->field_generators_,
                          (FieldDescriptor *)(*(long *)(pDVar3 + 0x30) + lVar9));
      iVar1 = (*pFVar2->_vptr_FieldGenerator[3])(pFVar2);
      iVar8 = iVar8 + iVar1;
      lVar6 = lVar6 + 1;
      pDVar3 = this->descriptor_;
      lVar9 = lVar9 + 0x78;
    } while (lVar6 < *(int *)(pDVar3 + 0x2c));
    if (0 < iVar8) {
      pjVar7 = (java *)0x0;
      uVar4 = extraout_RDX;
      do {
        GetBitFieldName_abi_cxx11_(&local_50,pjVar7,(int)uVar4);
        io::Printer::Print(printer,"private int $bit_field_name$;\n","bit_field_name",&local_50);
        uVar4 = extraout_RDX_00;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          uVar4 = extraout_RDX_01;
        }
        uVar5 = (int)pjVar7 + 1;
        pjVar7 = (java *)(ulong)uVar5;
      } while (iVar8 + 0x1fU >> 5 != uVar5);
      pDVar3 = this->descriptor_;
    }
  }
  if (0 < *(int *)(pDVar3 + 0x2c)) {
    lVar9 = 0;
    lVar6 = 0;
    do {
      io::Printer::Print(printer,"\n");
      anon_unknown_5::PrintFieldComment
                (printer,(FieldDescriptor *)(*(long *)(this->descriptor_ + 0x30) + lVar9));
      pFVar2 = FieldGeneratorMap::get
                         (&this->field_generators_,
                          (FieldDescriptor *)(*(long *)(this->descriptor_ + 0x30) + lVar9));
      (*pFVar2->_vptr_FieldGenerator[6])(pFVar2,printer);
      lVar6 = lVar6 + 1;
      pDVar3 = this->descriptor_;
      lVar9 = lVar9 + 0x78;
    } while (lVar6 < *(int *)(pDVar3 + 0x2c));
  }
  io::Printer::Print(printer,"\n// @@protoc_insertion_point(builder_scope:$full_name$)\n",
                     "full_name",*(string **)(pDVar3 + 8));
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,"}\n");
  return;
}

Assistant:

void MessageGenerator::GenerateBuilder(io::Printer* printer) {
  printer->Print(
    "public static Builder newBuilder() { return Builder.create(); }\n"
    "public Builder newBuilderForType() { return newBuilder(); }\n"
    "public static Builder newBuilder($classname$ prototype) {\n"
    "  return newBuilder().mergeFrom(prototype);\n"
    "}\n"
    "public Builder toBuilder() { return newBuilder(this); }\n"
    "\n",
    "classname", ClassName(descriptor_));

  if (HasNestedBuilders(descriptor_)) {
     printer->Print(
      "@java.lang.Override\n"
      "protected Builder newBuilderForType(\n"
      "    com.google.protobuf.GeneratedMessage.BuilderParent parent) {\n"
      "  Builder builder = new Builder(parent);\n"
      "  return builder;\n"
      "}\n");
  }

  WriteMessageDocComment(printer, descriptor_);

  if (descriptor_->extension_range_count() > 0) {
    if (HasDescriptorMethods(descriptor_)) {
      printer->Print(
        "public static final class Builder extends\n"
        "    com.google.protobuf.GeneratedMessage.ExtendableBuilder<\n"
        "      $classname$, Builder> implements $classname$OrBuilder {\n",
        "classname", ClassName(descriptor_));
    } else {
      printer->Print(
        "public static final class Builder extends\n"
        "    com.google.protobuf.GeneratedMessageLite.ExtendableBuilder<\n"
        "      $classname$, Builder> implements $classname$OrBuilder {\n",
        "classname", ClassName(descriptor_));
    }
  } else {
    if (HasDescriptorMethods(descriptor_)) {
      printer->Print(
        "public static final class Builder extends\n"
        "    com.google.protobuf.GeneratedMessage.Builder<Builder>\n"
         "   implements $classname$OrBuilder {\n",
        "classname", ClassName(descriptor_));
    } else {
      printer->Print(
        "public static final class Builder extends\n"
        "    com.google.protobuf.GeneratedMessageLite.Builder<\n"
        "      $classname$, Builder>\n"
        "    implements $classname$OrBuilder {\n",
        "classname", ClassName(descriptor_));
    }
  }
  printer->Indent();

  GenerateDescriptorMethods(printer);
  GenerateCommonBuilderMethods(printer);

  if (HasGeneratedMethods(descriptor_)) {
    GenerateIsInitialized(printer, DONT_MEMOIZE);
    GenerateBuilderParsingMethods(printer);
  }

  // Integers for bit fields.
  int totalBits = 0;
  for (int i = 0; i < descriptor_->field_count(); i++) {
    totalBits += field_generators_.get(descriptor_->field(i))
        .GetNumBitsForBuilder();
  }
  int totalInts = (totalBits + 31) / 32;
  for (int i = 0; i < totalInts; i++) {
    printer->Print("private int $bit_field_name$;\n",
      "bit_field_name", GetBitFieldName(i));
  }

  for (int i = 0; i < descriptor_->field_count(); i++) {
    printer->Print("\n");
    PrintFieldComment(printer, descriptor_->field(i));
    field_generators_.get(descriptor_->field(i))
                     .GenerateBuilderMembers(printer);
  }

  printer->Print(
    "\n"
    "// @@protoc_insertion_point(builder_scope:$full_name$)\n",
    "full_name", descriptor_->full_name());

  printer->Outdent();
  printer->Print("}\n");
}